

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimation
          (OgreBinarySerializer *this,Skeleton *skeleton)

{
  bool bVar1;
  Animation *this_00;
  Logger *this_01;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar2;
  basic_formatter *this_02;
  float fVar3;
  size_type local_218;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_98;
  string local_78;
  uint16_t local_52;
  undefined1 local_50 [6];
  uint16_t id;
  Animation *local_20;
  Animation *anim;
  Skeleton *skeleton_local;
  OgreBinarySerializer *this_local;
  
  anim = (Animation *)skeleton;
  skeleton_local = (Skeleton *)this;
  this_00 = (Animation *)operator_new(0x70);
  Ogre::Animation::Animation(this_00,(Skeleton *)anim);
  local_20 = this_00;
  ReadLine_abi_cxx11_((string *)local_50,this);
  std::__cxx11::string::operator=((string *)&local_20->name,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  fVar3 = Read<float>(this);
  local_20->length = fVar3;
  bVar1 = AtEnd(this);
  if (!bVar1) {
    local_52 = ReadHeader(this,true);
    if (local_52 == 0x4010) {
      ReadLine_abi_cxx11_(&local_78,this);
      std::__cxx11::string::operator=((string *)&local_20->baseName,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      fVar3 = Read<float>(this);
      local_20->baseTime = fVar3;
      local_52 = ReadHeader(this,true);
    }
    while (bVar1 = AtEnd(this), !bVar1 && local_52 == 0x4100) {
      ReadSkeletonAnimationTrack(this,(Skeleton *)anim,local_20);
      bVar1 = AtEnd(this);
      if (!bVar1) {
        local_52 = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::push_back
            ((vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_> *)
             &(anim->name)._M_string_length,&local_20);
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[5]>(&local_210,(char (*) [5])"    ");
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_210,&local_20->name);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,(char (*) [3])0xb5c0ff);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,&local_20->length);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,(char (*) [7])" sec, ");
  local_218 = std::
              vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
              ::size(&local_20->tracks);
  pbVar2 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar2,&local_218);
  this_02 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (pbVar2,(char (*) [9])" tracks)");
  Formatter::basic_formatter::operator_cast_to_string(&local_98,this_02);
  Logger::debug(this_01,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_210);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimation(Skeleton *skeleton)
{
    Animation *anim = new Animation(skeleton);
    anim->name = ReadLine();
    anim->length = Read<float>();

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        if (id == SKELETON_ANIMATION_BASEINFO)
        {
            anim->baseName = ReadLine();
            anim->baseTime = Read<float>();

            // Advance to first track
            id = ReadHeader();
        }

        while (!AtEnd() && id == SKELETON_ANIMATION_TRACK)
        {
            ReadSkeletonAnimationTrack(skeleton, anim);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    skeleton->animations.push_back(anim);

    ASSIMP_LOG_DEBUG_F( "    ", anim->name, " (", anim->length, " sec, ", anim->tracks.size(), " tracks)");
}